

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O3

void __thiscall duckdb::BuiltinFunctions::AddFunction(BuiltinFunctions *this,ScalarFunctionSet *set)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CreateScalarFunctionInfo info;
  ScalarFunctionSet local_208;
  CreateScalarFunctionInfo local_1d0;
  
  paVar2 = &local_208.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
  local_208.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
       (set->super_FunctionSet<duckdb::ScalarFunction>).name._M_dataplus._M_p;
  paVar1 = &(set->super_FunctionSet<duckdb::ScalarFunction>).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p == paVar1) {
    local_208.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_208.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._8_8_ =
         *(undefined8 *)((long)&(set->super_FunctionSet<duckdb::ScalarFunction>).name.field_2 + 8);
    local_208.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_208.super_FunctionSet<duckdb::ScalarFunction>.name.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_208.super_FunctionSet<duckdb::ScalarFunction>.name._M_string_length =
       (set->super_FunctionSet<duckdb::ScalarFunction>).name._M_string_length;
  (set->super_FunctionSet<duckdb::ScalarFunction>).name._M_dataplus._M_p = (pointer)paVar1;
  (set->super_FunctionSet<duckdb::ScalarFunction>).name._M_string_length = 0;
  (set->super_FunctionSet<duckdb::ScalarFunction>).name.field_2._M_local_buf[0] = '\0';
  local_208.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (set->super_FunctionSet<duckdb::ScalarFunction>).functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_208.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (set->super_FunctionSet<duckdb::ScalarFunction>).functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_208.super_FunctionSet<duckdb::ScalarFunction>.functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (set->super_FunctionSet<duckdb::ScalarFunction>).functions.
       super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
       super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (set->super_FunctionSet<duckdb::ScalarFunction>).functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (set->super_FunctionSet<duckdb::ScalarFunction>).functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (set->super_FunctionSet<duckdb::ScalarFunction>).functions.
  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
  super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CreateScalarFunctionInfo::CreateScalarFunctionInfo(&local_1d0,&local_208);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_208.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_208.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
  }
  local_1d0.super_CreateFunctionInfo.super_CreateInfo.internal = true;
  Catalog::CreateFunction(this->catalog,this->transaction,&local_1d0.super_CreateFunctionInfo);
  local_1d0.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateScalarFunctionInfo_0243b0a0;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
            (&local_1d0.functions.super_FunctionSet<duckdb::ScalarFunction>.functions.
              super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.functions.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p !=
      &local_1d0.functions.super_FunctionSet<duckdb::ScalarFunction>.name.field_2) {
    operator_delete(local_1d0.functions.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus.
                    _M_p);
  }
  local_1d0.super_CreateFunctionInfo.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateFunctionInfo_0243b628;
  ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (&local_1d0.super_CreateFunctionInfo.descriptions.
              super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.super_CreateFunctionInfo.alias_of._M_dataplus._M_p !=
      &local_1d0.super_CreateFunctionInfo.alias_of.field_2) {
    operator_delete(local_1d0.super_CreateFunctionInfo.alias_of._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.super_CreateFunctionInfo.name._M_dataplus._M_p !=
      &local_1d0.super_CreateFunctionInfo.name.field_2) {
    operator_delete(local_1d0.super_CreateFunctionInfo.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo((CreateInfo *)&local_1d0);
  return;
}

Assistant:

void BuiltinFunctions::AddFunction(ScalarFunctionSet set) {
	CreateScalarFunctionInfo info(std::move(set));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}